

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_reader.cc
# Opt level: O1

property_type * __thiscall
properties_actor<properties_actor_traits>::allocate_abi_cxx11_
          (properties_actor<properties_actor_traits> *this)

{
  property_type *ppVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this->current_reference = (current_reference_callback)get_abi_cxx11_;
  *(undefined8 *)&this->field_0x58 = 0;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::
  vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string,std::__cxx11::string>
            ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              *)this->properties,&local_60,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  ppVar1 = (this->properties->
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish + -1;
  (this->property)._M_data = ppVar1;
  return ppVar1;
}

Assistant:

property_type & allocate() {
            current_reference = &properties_actor::get;
            properties.emplace_back(std::string(), std::string());
            property = properties.back();
            return property;
        }